

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O2

void __thiscall CCharacterCore::AddDragVelocity(CCharacterCore *this)

{
  float fVar1;
  float Max;
  
  Max = (float)(this->m_pWorld->m_Tuning).m_HookDragSpeed.m_Value / 100.0;
  fVar1 = SaturatedAdd<float>(-Max,Max,(this->m_Vel).field_0.x,(this->m_HookDragVel).field_0.x);
  (this->m_Vel).field_0.x = fVar1;
  fVar1 = SaturatedAdd<float>(-Max,Max,(this->m_Vel).field_1.y,(this->m_HookDragVel).field_1.y);
  (this->m_Vel).field_1.y = fVar1;
  return;
}

Assistant:

void CCharacterCore::AddDragVelocity()
{
	// Apply hook interaction velocity
	float DragSpeed = m_pWorld->m_Tuning.m_HookDragSpeed;

	m_Vel.x = SaturatedAdd(-DragSpeed, DragSpeed, m_Vel.x, m_HookDragVel.x);
	m_Vel.y = SaturatedAdd(-DragSpeed, DragSpeed, m_Vel.y, m_HookDragVel.y);
}